

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallTargetGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallTargetGenerator *this,string *config)

{
  Snapshot snapshot;
  undefined8 this_00;
  cmLocalGenerator *lg;
  char *pcVar1;
  cmGeneratorExpression ge;
  allocator local_e9;
  undefined1 local_e8 [32];
  long local_c8;
  undefined1 local_c0 [64];
  cmGeneratorExpression local_80;
  Snapshot local_40;
  
  cmState::Snapshot::Snapshot(&local_40,(cmState *)0x0);
  local_e8._0_8_ = local_e8 + 0x10;
  local_e8._8_8_ = 0;
  local_e8[0x10] = '\0';
  local_c8 = 0;
  snapshot.Position.Tree = local_40.Position.Tree;
  snapshot.State = local_40.State;
  snapshot.Position.Position = local_40.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace
            ((cmListFileBacktrace *)local_c0,snapshot,(cmCommandContext *)local_e8);
  cmGeneratorExpression::cmGeneratorExpression(&local_80,(cmListFileBacktrace *)local_c0);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_c0);
  std::__cxx11::string::~string((string *)local_e8);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_e8,(string *)&local_80);
  this_00 = local_e8._0_8_;
  lg = cmGeneratorTarget::GetLocalGenerator(this->Target);
  local_c0._0_8_ = (long)local_c0 + 0x10;
  local_c0._8_8_ = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
  local_c0[0x10] = '\0';
  pcVar1 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)this_00,lg,config,false,
                      (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(string *)local_c0);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_e9);
  std::__cxx11::string::~string((string *)local_c0);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_e8);
  cmGeneratorExpression::~cmGeneratorExpression(&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmInstallTargetGenerator::GetDestination(std::string const& config) const
{
  cmGeneratorExpression ge;
  return ge.Parse(this->Destination)
    ->Evaluate(this->Target->GetLocalGenerator(), config);
}